

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameterization.cpp
# Opt level: O3

void __thiscall Parameterization::PrintPlot3D(Parameterization *this,ofstream *outfile)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  
  (**this->_vptr_Parameterization)();
  this->G = 0;
  if (0 < this->Gmax) {
    uVar7 = 0;
    do {
      (*this->_vptr_Parameterization[5])(this,uVar7);
      this->L = 0;
      if (this->Lmax < 1) {
LAB_00103f0c:
        this->L = 0;
      }
      else {
        do {
          this->K = 0;
          iVar4 = this->Kmax;
          if (0 < iVar4) {
            iVar2 = this->Jmax;
            iVar5 = 0;
            do {
              this->J = 0;
              if (0 < iVar2) {
                uVar7 = 0;
                do {
                  (*this->_vptr_Parameterization[2])
                            (this,uVar7,(ulong)(uint)this->K,(ulong)(uint)this->L,
                             (ulong)(uint)this->G);
                  poVar3 = std::ostream::_M_insert<double>(extraout_XMM0_Qa);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
                  iVar2 = this->Jmax;
                  uVar6 = this->J + 1;
                  uVar7 = (ulong)uVar6;
                  this->J = uVar6;
                } while ((int)uVar6 < iVar2);
                iVar5 = this->K;
                iVar4 = this->Kmax;
              }
              iVar5 = iVar5 + 1;
              this->K = iVar5;
            } while (iVar5 < iVar4);
          }
          cVar1 = (char)outfile;
          std::ios::widen((char)*(undefined8 *)(*(long *)outfile + -0x18) + cVar1);
          std::ostream::put(cVar1);
          std::ostream::flush();
          iVar4 = this->L + 1;
          this->L = iVar4;
        } while (iVar4 < this->Lmax);
        this->L = 0;
        if (this->Lmax < 1) goto LAB_00103f0c;
        do {
          this->K = 0;
          iVar4 = this->Kmax;
          if (0 < iVar4) {
            iVar2 = this->Jmax;
            iVar5 = 0;
            do {
              this->J = 0;
              if (0 < iVar2) {
                uVar7 = 0;
                do {
                  (*this->_vptr_Parameterization[3])
                            (this,uVar7,(ulong)(uint)this->K,(ulong)(uint)this->L,
                             (ulong)(uint)this->G);
                  poVar3 = std::ostream::_M_insert<double>(extraout_XMM0_Qa_00);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
                  iVar2 = this->Jmax;
                  uVar6 = this->J + 1;
                  uVar7 = (ulong)uVar6;
                  this->J = uVar6;
                } while ((int)uVar6 < iVar2);
                iVar5 = this->K;
                iVar4 = this->Kmax;
              }
              iVar5 = iVar5 + 1;
              this->K = iVar5;
            } while (iVar5 < iVar4);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)outfile + -0x18) + cVar1);
          std::ostream::put(cVar1);
          std::ostream::flush();
          iVar4 = this->L + 1;
          this->L = iVar4;
        } while (iVar4 < this->Lmax);
        this->L = 0;
        if (0 < this->Lmax) {
          do {
            this->K = 0;
            iVar4 = this->Kmax;
            if (0 < iVar4) {
              iVar2 = this->Jmax;
              iVar5 = 0;
              do {
                this->J = 0;
                if (0 < iVar2) {
                  uVar7 = 0;
                  do {
                    (*this->_vptr_Parameterization[4])
                              (this,uVar7,(ulong)(uint)this->K,(ulong)(uint)this->L,
                               (ulong)(uint)this->G);
                    poVar3 = std::ostream::_M_insert<double>(extraout_XMM0_Qa_01);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
                    iVar2 = this->Jmax;
                    uVar6 = this->J + 1;
                    uVar7 = (ulong)uVar6;
                    this->J = uVar6;
                  } while ((int)uVar6 < iVar2);
                  iVar5 = this->K;
                  iVar4 = this->Kmax;
                }
                iVar5 = iVar5 + 1;
                this->K = iVar5;
              } while (iVar5 < iVar4);
            }
            std::ios::widen((char)*(undefined8 *)(*(long *)outfile + -0x18) + cVar1);
            std::ostream::put(cVar1);
            std::ostream::flush();
            iVar4 = this->L + 1;
            this->L = iVar4;
          } while (iVar4 < this->Lmax);
        }
      }
      uVar6 = this->G + 1;
      uVar7 = (ulong)uVar6;
      this->G = uVar6;
    } while ((int)uVar6 < this->Gmax);
  }
  return;
}

Assistant:

void Parameterization::PrintPlot3D(ofstream& outfile) {

  PrintPlot3DHeader(outfile);

  for (G = 0; G < Gmax; G++) {

    setGridIndexRanges(G);

    // All x-coordinates
    for (L = 0; L < Lmax; L++) {
    for (K = 0; K < Kmax; K++) {
    for (J = 0; J < Jmax; J++) {
      outfile << coordinateX(J, K, L, G) << " ";
    }
    }
    outfile << endl;
    }

    // All y-coordinates
    for (L = 0; L < Lmax; L++) {
    for (K = 0; K < Kmax; K++) {
    for (J = 0; J < Jmax; J++) {
      outfile << coordinateY(J, K, L, G) << " ";
    }
    }
    outfile << endl;
    }

    // All z-coordinates
    for (L = 0; L < Lmax; L++) {
    for (K = 0; K < Kmax; K++) {
    for (J = 0; J < Jmax; J++) {
      outfile << coordinateZ(J, K, L, G) << " ";
    }
    }
    outfile << endl;
    }

  }  //End: G for-loop
}